

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  Geometry *pGVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined4 uVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  uint uVar93;
  undefined1 (*pauVar94) [16];
  uint uVar95;
  ulong uVar96;
  long lVar97;
  long lVar98;
  Scene *pSVar99;
  ulong uVar100;
  ulong uVar101;
  ulong uVar102;
  undefined1 (*pauVar103) [16];
  ulong uVar104;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar111 [32];
  undefined1 auVar110 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar117;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  float fVar133;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  float fVar143;
  undefined1 auVar144 [32];
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  undefined1 auVar152 [32];
  uint uVar154;
  uint uVar155;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  uint uVar159;
  undefined1 auVar153 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  float fVar164;
  undefined1 auVar165 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar166 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2804;
  long local_2800;
  ulong local_27f8;
  RayQueryContext *local_27f0;
  long local_27e8;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  RTCFilterFunctionNArguments local_27a0;
  float local_2770;
  float local_276c;
  float local_2768;
  float local_2764;
  float local_2760;
  undefined4 local_275c;
  uint local_2758;
  uint local_2754;
  uint local_2750;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar103 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar109 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar118 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar132._8_4_ = 0x7fffffff;
    auVar132._0_8_ = 0x7fffffff7fffffff;
    auVar132._12_4_ = 0x7fffffff;
    auVar132 = vandps_avx((undefined1  [16])aVar3,auVar132);
    auVar135._8_4_ = 0x219392ef;
    auVar135._0_8_ = 0x219392ef219392ef;
    auVar135._12_4_ = 0x219392ef;
    auVar132 = vcmpps_avx(auVar132,auVar135,1);
    auVar132 = vblendvps_avx((undefined1  [16])aVar3,auVar135,auVar132);
    auVar135 = vrcpps_avx(auVar132);
    fVar117 = auVar135._0_4_;
    auVar127._0_4_ = auVar132._0_4_ * fVar117;
    fVar122 = auVar135._4_4_;
    auVar127._4_4_ = auVar132._4_4_ * fVar122;
    fVar123 = auVar135._8_4_;
    auVar127._8_4_ = auVar132._8_4_ * fVar123;
    fVar124 = auVar135._12_4_;
    auVar127._12_4_ = auVar132._12_4_ * fVar124;
    auVar136._8_4_ = 0x3f800000;
    auVar136._0_8_ = 0x3f8000003f800000;
    auVar136._12_4_ = 0x3f800000;
    auVar132 = vsubps_avx(auVar136,auVar127);
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar1;
    local_23e0._0_4_ = uVar1;
    local_23e0._8_4_ = uVar1;
    local_23e0._12_4_ = uVar1;
    local_23e0._16_4_ = uVar1;
    local_23e0._20_4_ = uVar1;
    local_23e0._24_4_ = uVar1;
    local_23e0._28_4_ = uVar1;
    auVar142 = ZEXT3264(local_23e0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar1;
    local_2400._0_4_ = uVar1;
    local_2400._8_4_ = uVar1;
    local_2400._12_4_ = uVar1;
    local_2400._16_4_ = uVar1;
    local_2400._20_4_ = uVar1;
    local_2400._24_4_ = uVar1;
    local_2400._28_4_ = uVar1;
    auVar145 = ZEXT3264(local_2400);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar1;
    local_2420._0_4_ = uVar1;
    local_2420._8_4_ = uVar1;
    local_2420._12_4_ = uVar1;
    local_2420._16_4_ = uVar1;
    local_2420._20_4_ = uVar1;
    local_2420._24_4_ = uVar1;
    local_2420._28_4_ = uVar1;
    auVar153 = ZEXT3264(local_2420);
    auVar128._0_4_ = fVar117 + fVar117 * auVar132._0_4_;
    auVar128._4_4_ = fVar122 + fVar122 * auVar132._4_4_;
    auVar128._8_4_ = fVar123 + fVar123 * auVar132._8_4_;
    auVar128._12_4_ = fVar124 + fVar124 * auVar132._12_4_;
    auVar132 = vshufps_avx(auVar128,auVar128,0);
    local_2440._16_16_ = auVar132;
    local_2440._0_16_ = auVar132;
    auVar161 = ZEXT3264(local_2440);
    auVar132 = vmovshdup_avx(auVar128);
    auVar135 = vshufps_avx(auVar128,auVar128,0x55);
    local_2460._16_16_ = auVar135;
    local_2460._0_16_ = auVar135;
    auVar163 = ZEXT3264(local_2460);
    auVar135 = vshufpd_avx(auVar128,auVar128,1);
    auVar127 = vshufps_avx(auVar128,auVar128,0xaa);
    local_2480._16_16_ = auVar127;
    local_2480._0_16_ = auVar127;
    auVar166 = ZEXT3264(local_2480);
    local_27f8 = (ulong)(auVar128._0_4_ < 0.0) << 5;
    uVar100 = (ulong)(auVar132._0_4_ < 0.0) << 5 | 0x40;
    uVar101 = (ulong)(auVar135._0_4_ < 0.0) << 5 | 0x80;
    uVar102 = local_27f8 ^ 0x20;
    auVar132 = vshufps_avx(auVar109,auVar109,0);
    local_24a0._16_16_ = auVar132;
    local_24a0._0_16_ = auVar132;
    auVar174 = ZEXT3264(local_24a0);
    auVar132 = vshufps_avx(auVar118,auVar118,0);
    auVar108 = ZEXT3264(CONCAT1616(auVar132,auVar132));
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar111._8_4_ = 0xbf800000;
    auVar111._0_8_ = 0xbf800000bf800000;
    auVar111._12_4_ = 0xbf800000;
    auVar111._16_4_ = 0xbf800000;
    auVar111._20_4_ = 0xbf800000;
    auVar111._24_4_ = 0xbf800000;
    auVar111._28_4_ = 0xbf800000;
    auVar130._8_4_ = 0x3f800000;
    auVar130._0_8_ = 0x3f8000003f800000;
    auVar130._12_4_ = 0x3f800000;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = 0x3f800000;
    _local_24e0 = vblendvps_avx(auVar130,auVar111,local_24c0);
    local_27f0 = context;
LAB_00e6485e:
    if (pauVar103 != (undefined1 (*) [16])&local_23a0) {
      pauVar94 = pauVar103 + -1;
      pauVar103 = pauVar103 + -1;
      if (*(float *)(*pauVar94 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar96 = *(ulong *)*pauVar103;
        while ((uVar96 & 8) == 0) {
          auVar111 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + local_27f8),auVar142._0_32_);
          auVar70._4_4_ = auVar161._4_4_ * auVar111._4_4_;
          auVar70._0_4_ = auVar161._0_4_ * auVar111._0_4_;
          auVar70._8_4_ = auVar161._8_4_ * auVar111._8_4_;
          auVar70._12_4_ = auVar161._12_4_ * auVar111._12_4_;
          auVar70._16_4_ = auVar161._16_4_ * auVar111._16_4_;
          auVar70._20_4_ = auVar161._20_4_ * auVar111._20_4_;
          auVar70._24_4_ = auVar161._24_4_ * auVar111._24_4_;
          auVar70._28_4_ = auVar111._28_4_;
          auVar111 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + uVar100),auVar145._0_32_);
          auVar71._4_4_ = auVar163._4_4_ * auVar111._4_4_;
          auVar71._0_4_ = auVar163._0_4_ * auVar111._0_4_;
          auVar71._8_4_ = auVar163._8_4_ * auVar111._8_4_;
          auVar71._12_4_ = auVar163._12_4_ * auVar111._12_4_;
          auVar71._16_4_ = auVar163._16_4_ * auVar111._16_4_;
          auVar71._20_4_ = auVar163._20_4_ * auVar111._20_4_;
          auVar71._24_4_ = auVar163._24_4_ * auVar111._24_4_;
          auVar71._28_4_ = auVar111._28_4_;
          auVar111 = vmaxps_avx(auVar70,auVar71);
          auVar130 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + uVar101),auVar153._0_32_);
          auVar72._4_4_ = auVar166._4_4_ * auVar130._4_4_;
          auVar72._0_4_ = auVar166._0_4_ * auVar130._0_4_;
          auVar72._8_4_ = auVar166._8_4_ * auVar130._8_4_;
          auVar72._12_4_ = auVar166._12_4_ * auVar130._12_4_;
          auVar72._16_4_ = auVar166._16_4_ * auVar130._16_4_;
          auVar72._20_4_ = auVar166._20_4_ * auVar130._20_4_;
          auVar72._24_4_ = auVar166._24_4_ * auVar130._24_4_;
          auVar72._28_4_ = auVar130._28_4_;
          auVar130 = vmaxps_avx(auVar72,auVar174._0_32_);
          local_2660 = vmaxps_avx(auVar111,auVar130);
          auVar111 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + uVar102),auVar142._0_32_);
          auVar73._4_4_ = auVar161._4_4_ * auVar111._4_4_;
          auVar73._0_4_ = auVar161._0_4_ * auVar111._0_4_;
          auVar73._8_4_ = auVar161._8_4_ * auVar111._8_4_;
          auVar73._12_4_ = auVar161._12_4_ * auVar111._12_4_;
          auVar73._16_4_ = auVar161._16_4_ * auVar111._16_4_;
          auVar73._20_4_ = auVar161._20_4_ * auVar111._20_4_;
          auVar73._24_4_ = auVar161._24_4_ * auVar111._24_4_;
          auVar73._28_4_ = auVar111._28_4_;
          auVar111 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + (uVar100 ^ 0x20)),
                                auVar145._0_32_);
          auVar74._4_4_ = auVar163._4_4_ * auVar111._4_4_;
          auVar74._0_4_ = auVar163._0_4_ * auVar111._0_4_;
          auVar74._8_4_ = auVar163._8_4_ * auVar111._8_4_;
          auVar74._12_4_ = auVar163._12_4_ * auVar111._12_4_;
          auVar74._16_4_ = auVar163._16_4_ * auVar111._16_4_;
          auVar74._20_4_ = auVar163._20_4_ * auVar111._20_4_;
          auVar74._24_4_ = auVar163._24_4_ * auVar111._24_4_;
          auVar74._28_4_ = auVar111._28_4_;
          auVar111 = vminps_avx(auVar73,auVar74);
          auVar130 = vsubps_avx(*(undefined1 (*) [32])(uVar96 + 0x40 + (uVar101 ^ 0x20)),
                                auVar153._0_32_);
          auVar75._4_4_ = auVar166._4_4_ * auVar130._4_4_;
          auVar75._0_4_ = auVar166._0_4_ * auVar130._0_4_;
          auVar75._8_4_ = auVar166._8_4_ * auVar130._8_4_;
          auVar75._12_4_ = auVar166._12_4_ * auVar130._12_4_;
          auVar75._16_4_ = auVar166._16_4_ * auVar130._16_4_;
          auVar75._20_4_ = auVar166._20_4_ * auVar130._20_4_;
          auVar75._24_4_ = auVar166._24_4_ * auVar130._24_4_;
          auVar75._28_4_ = auVar130._28_4_;
          auVar130 = vminps_avx(auVar75,auVar108._0_32_);
          auVar111 = vminps_avx(auVar111,auVar130);
          auVar111 = vcmpps_avx(local_2660,auVar111,2);
          uVar93 = vmovmskps_avx(auVar111);
          if (uVar93 == 0) goto LAB_00e6485e;
          uVar93 = uVar93 & 0xff;
          uVar104 = uVar96 & 0xfffffffffffffff0;
          lVar97 = 0;
          if (uVar93 != 0) {
            for (; (uVar93 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
            }
          }
          uVar96 = *(ulong *)(uVar104 + lVar97 * 8);
          uVar93 = uVar93 - 1 & uVar93;
          if (uVar93 != 0) {
            uVar95 = *(uint *)(local_2660 + lVar97 * 4);
            lVar97 = 0;
            if (uVar93 != 0) {
              for (; (uVar93 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
              }
            }
            uVar4 = *(ulong *)(uVar104 + lVar97 * 8);
            uVar154 = *(uint *)(local_2660 + lVar97 * 4);
            uVar93 = uVar93 - 1 & uVar93;
            if (uVar93 == 0) {
              if (uVar95 < uVar154) {
                *(ulong *)*pauVar103 = uVar4;
                *(uint *)(*pauVar103 + 8) = uVar154;
                pauVar103 = pauVar103 + 1;
              }
              else {
                *(ulong *)*pauVar103 = uVar96;
                *(uint *)(*pauVar103 + 8) = uVar95;
                pauVar103 = pauVar103 + 1;
                uVar96 = uVar4;
              }
            }
            else {
              auVar109._8_8_ = 0;
              auVar109._0_8_ = uVar96;
              auVar132 = vpunpcklqdq_avx(auVar109,ZEXT416(uVar95));
              auVar118._8_8_ = 0;
              auVar118._0_8_ = uVar4;
              auVar109 = vpunpcklqdq_avx(auVar118,ZEXT416(uVar154));
              lVar97 = 0;
              if (uVar93 != 0) {
                for (; (uVar93 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                }
              }
              auVar129._8_8_ = 0;
              auVar129._0_8_ = *(ulong *)(uVar104 + lVar97 * 8);
              auVar135 = vpunpcklqdq_avx(auVar129,ZEXT416(*(uint *)(local_2660 + lVar97 * 4)));
              auVar118 = vpcmpgtd_avx(auVar109,auVar132);
              uVar93 = uVar93 - 1 & uVar93;
              if (uVar93 == 0) {
                auVar127 = vpshufd_avx(auVar118,0xaa);
                auVar118 = vblendvps_avx(auVar109,auVar132,auVar127);
                auVar132 = vblendvps_avx(auVar132,auVar109,auVar127);
                auVar109 = vpcmpgtd_avx(auVar135,auVar118);
                auVar127 = vpshufd_avx(auVar109,0xaa);
                auVar109 = vblendvps_avx(auVar135,auVar118,auVar127);
                auVar118 = vblendvps_avx(auVar118,auVar135,auVar127);
                auVar135 = vpcmpgtd_avx(auVar118,auVar132);
                auVar127 = vpshufd_avx(auVar135,0xaa);
                auVar135 = vblendvps_avx(auVar118,auVar132,auVar127);
                auVar132 = vblendvps_avx(auVar132,auVar118,auVar127);
                *pauVar103 = auVar132;
                pauVar103[1] = auVar135;
                uVar96 = auVar109._0_8_;
                pauVar103 = pauVar103 + 2;
              }
              else {
                lVar97 = 0;
                if (uVar93 != 0) {
                  for (; (uVar93 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                  }
                }
                auVar137._8_8_ = 0;
                auVar137._0_8_ = *(ulong *)(uVar104 + lVar97 * 8);
                auVar127 = vpunpcklqdq_avx(auVar137,ZEXT416(*(uint *)(local_2660 + lVar97 * 4)));
                uVar93 = uVar93 - 1 & uVar93;
                uVar96 = (ulong)uVar93;
                if (uVar93 == 0) {
                  auVar128 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar109,auVar132,auVar128);
                  auVar132 = vblendvps_avx(auVar132,auVar109,auVar128);
                  auVar109 = vpcmpgtd_avx(auVar127,auVar135);
                  auVar128 = vpshufd_avx(auVar109,0xaa);
                  auVar109 = vblendvps_avx(auVar127,auVar135,auVar128);
                  auVar135 = vblendvps_avx(auVar135,auVar127,auVar128);
                  auVar127 = vpcmpgtd_avx(auVar135,auVar132);
                  auVar128 = vpshufd_avx(auVar127,0xaa);
                  auVar127 = vblendvps_avx(auVar135,auVar132,auVar128);
                  auVar132 = vblendvps_avx(auVar132,auVar135,auVar128);
                  auVar135 = vpcmpgtd_avx(auVar109,auVar118);
                  auVar128 = vpshufd_avx(auVar135,0xaa);
                  auVar135 = vblendvps_avx(auVar109,auVar118,auVar128);
                  auVar109 = vblendvps_avx(auVar118,auVar109,auVar128);
                  auVar118 = vpcmpgtd_avx(auVar127,auVar109);
                  auVar128 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar127,auVar109,auVar128);
                  auVar109 = vblendvps_avx(auVar109,auVar127,auVar128);
                  *pauVar103 = auVar132;
                  pauVar103[1] = auVar109;
                  pauVar103[2] = auVar118;
                  uVar96 = auVar135._0_8_;
                  pauVar103 = pauVar103 + 3;
                }
                else {
                  *pauVar103 = auVar132;
                  pauVar103[1] = auVar109;
                  pauVar103[2] = auVar135;
                  pauVar94 = pauVar103 + 3;
                  pauVar103[3] = auVar127;
                  do {
                    lVar97 = 0;
                    if (uVar96 != 0) {
                      for (; (uVar96 >> lVar97 & 1) == 0; lVar97 = lVar97 + 1) {
                      }
                    }
                    auVar110._8_8_ = 0;
                    auVar110._0_8_ = *(ulong *)(uVar104 + lVar97 * 8);
                    auVar132 = vpunpcklqdq_avx(auVar110,ZEXT416(*(uint *)(local_2660 + lVar97 * 4)))
                    ;
                    pauVar94[1] = auVar132;
                    pauVar94 = pauVar94 + 1;
                    uVar96 = uVar96 & uVar96 - 1;
                  } while (uVar96 != 0);
                  lVar97 = 0;
                  while (pauVar94 != pauVar103) {
                    auVar132 = pauVar103[1];
                    uVar93 = vextractps_avx(auVar132,2);
                    for (lVar98 = 0x10;
                        (lVar97 != lVar98 && (*(uint *)(pauVar103[-1] + lVar98 + 8) < uVar93));
                        lVar98 = lVar98 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar103 + lVar98) =
                           *(undefined1 (*) [16])(pauVar103[-1] + lVar98);
                    }
                    *(undefined1 (*) [16])(*pauVar103 + lVar98) = auVar132;
                    lVar97 = lVar97 + -0x10;
                    pauVar103 = pauVar103 + 1;
                  }
                  uVar96 = *(ulong *)*pauVar94;
                  pauVar103 = pauVar94;
                }
              }
            }
          }
        }
        local_2800 = (ulong)((uint)uVar96 & 0xf) - 8;
        uVar96 = uVar96 & 0xfffffffffffffff0;
        for (local_27e8 = 0; local_27e8 != local_2800; local_27e8 = local_27e8 + 1) {
          lVar98 = local_27e8 * 0xe0;
          lVar97 = uVar96 + 0xd0 + lVar98;
          local_2680 = *(undefined8 *)(lVar97 + 0x10);
          uStack_2678 = *(undefined8 *)(lVar97 + 0x18);
          lVar97 = uVar96 + 0xc0 + lVar98;
          local_23c0 = *(undefined8 *)(lVar97 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar97 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          uStack_2670 = local_2680;
          uStack_2668 = uStack_2678;
          auVar131._16_16_ = *(undefined1 (*) [16])(uVar96 + 0x60 + lVar98);
          auVar131._0_16_ = *(undefined1 (*) [16])(uVar96 + lVar98);
          auVar138._16_16_ = *(undefined1 (*) [16])(uVar96 + 0x70 + lVar98);
          auVar138._0_16_ = *(undefined1 (*) [16])(uVar96 + 0x10 + lVar98);
          auVar141._16_16_ = *(undefined1 (*) [16])(uVar96 + 0x80 + lVar98);
          auVar141._0_16_ = *(undefined1 (*) [16])(uVar96 + 0x20 + lVar98);
          auVar132 = *(undefined1 (*) [16])(uVar96 + 0x30 + lVar98);
          auVar105._16_16_ = auVar132;
          auVar105._0_16_ = auVar132;
          auVar109 = *(undefined1 (*) [16])(uVar96 + 0x40 + lVar98);
          auVar112._16_16_ = auVar109;
          auVar112._0_16_ = auVar109;
          auVar118 = *(undefined1 (*) [16])(uVar96 + 0x50 + lVar98);
          auVar119._16_16_ = auVar118;
          auVar119._0_16_ = auVar118;
          auVar135 = *(undefined1 (*) [16])(uVar96 + 0x90 + lVar98);
          auVar152._16_16_ = auVar135;
          auVar152._0_16_ = auVar135;
          auVar135 = *(undefined1 (*) [16])(uVar96 + 0xa0 + lVar98);
          auVar160._16_16_ = auVar135;
          auVar160._0_16_ = auVar135;
          auVar135 = *(undefined1 (*) [16])(uVar96 + 0xb0 + lVar98);
          auVar162._16_16_ = auVar135;
          auVar162._0_16_ = auVar135;
          local_27e0 = vsubps_avx(auVar131,auVar105);
          local_27c0 = vsubps_avx(auVar138,auVar112);
          auVar111 = vsubps_avx(auVar141,auVar119);
          auVar130 = vsubps_avx(auVar152,auVar131);
          auVar70 = vsubps_avx(auVar160,auVar138);
          auVar71 = vsubps_avx(auVar162,auVar141);
          fVar124 = auVar71._0_4_;
          fVar164 = local_27c0._0_4_;
          fVar10 = auVar71._4_4_;
          fVar167 = local_27c0._4_4_;
          auVar76._4_4_ = fVar167 * fVar10;
          auVar76._0_4_ = fVar164 * fVar124;
          fVar20 = auVar71._8_4_;
          fVar168 = local_27c0._8_4_;
          auVar76._8_4_ = fVar168 * fVar20;
          fVar30 = auVar71._12_4_;
          fVar169 = local_27c0._12_4_;
          auVar76._12_4_ = fVar169 * fVar30;
          fVar40 = auVar71._16_4_;
          fVar170 = local_27c0._16_4_;
          auVar76._16_4_ = fVar170 * fVar40;
          fVar50 = auVar71._20_4_;
          fVar171 = local_27c0._20_4_;
          auVar76._20_4_ = fVar171 * fVar50;
          fVar60 = auVar71._24_4_;
          fVar172 = local_27c0._24_4_;
          auVar76._24_4_ = fVar172 * fVar60;
          auVar76._28_4_ = auVar132._12_4_;
          fVar125 = auVar70._0_4_;
          fVar143 = auVar111._0_4_;
          fVar11 = auVar70._4_4_;
          fVar146 = auVar111._4_4_;
          auVar78._4_4_ = fVar146 * fVar11;
          auVar78._0_4_ = fVar143 * fVar125;
          fVar21 = auVar70._8_4_;
          fVar147 = auVar111._8_4_;
          auVar78._8_4_ = fVar147 * fVar21;
          fVar31 = auVar70._12_4_;
          fVar148 = auVar111._12_4_;
          auVar78._12_4_ = fVar148 * fVar31;
          fVar41 = auVar70._16_4_;
          fVar149 = auVar111._16_4_;
          auVar78._16_4_ = fVar149 * fVar41;
          fVar51 = auVar70._20_4_;
          fVar150 = auVar111._20_4_;
          auVar78._20_4_ = fVar150 * fVar51;
          fVar61 = auVar70._24_4_;
          uVar77 = auVar109._12_4_;
          fVar151 = auVar111._24_4_;
          auVar78._24_4_ = fVar151 * fVar61;
          auVar78._28_4_ = uVar77;
          local_2700 = vsubps_avx(auVar78,auVar76);
          fVar126 = auVar130._0_4_;
          fVar12 = auVar130._4_4_;
          auVar79._4_4_ = fVar146 * fVar12;
          auVar79._0_4_ = fVar143 * fVar126;
          fVar22 = auVar130._8_4_;
          auVar79._8_4_ = fVar147 * fVar22;
          fVar32 = auVar130._12_4_;
          auVar79._12_4_ = fVar148 * fVar32;
          fVar42 = auVar130._16_4_;
          auVar79._16_4_ = fVar149 * fVar42;
          fVar52 = auVar130._20_4_;
          auVar79._20_4_ = fVar150 * fVar52;
          fVar62 = auVar130._24_4_;
          auVar79._24_4_ = fVar151 * fVar62;
          auVar79._28_4_ = uVar77;
          fVar133 = local_27e0._0_4_;
          fVar13 = local_27e0._4_4_;
          auVar81._4_4_ = fVar10 * fVar13;
          auVar81._0_4_ = fVar124 * fVar133;
          fVar23 = local_27e0._8_4_;
          auVar81._8_4_ = fVar20 * fVar23;
          fVar33 = local_27e0._12_4_;
          auVar81._12_4_ = fVar30 * fVar33;
          fVar43 = local_27e0._16_4_;
          auVar81._16_4_ = fVar40 * fVar43;
          fVar53 = local_27e0._20_4_;
          auVar81._20_4_ = fVar50 * fVar53;
          fVar63 = local_27e0._24_4_;
          fVar80 = auVar118._12_4_;
          auVar81._24_4_ = fVar60 * fVar63;
          auVar81._28_4_ = fVar80;
          auVar111 = vsubps_avx(auVar81,auVar79);
          auVar82._4_4_ = fVar11 * fVar13;
          auVar82._0_4_ = fVar125 * fVar133;
          auVar82._8_4_ = fVar21 * fVar23;
          auVar82._12_4_ = fVar31 * fVar33;
          auVar82._16_4_ = fVar41 * fVar43;
          auVar82._20_4_ = fVar51 * fVar53;
          auVar82._24_4_ = fVar61 * fVar63;
          auVar82._28_4_ = fVar80;
          auVar83._4_4_ = fVar167 * fVar12;
          auVar83._0_4_ = fVar164 * fVar126;
          auVar83._8_4_ = fVar168 * fVar22;
          auVar83._12_4_ = fVar169 * fVar32;
          auVar83._16_4_ = fVar170 * fVar42;
          auVar83._20_4_ = fVar171 * fVar52;
          auVar83._24_4_ = fVar172 * fVar62;
          auVar83._28_4_ = local_27c0._28_4_;
          local_2740 = vsubps_avx(auVar83,auVar82);
          uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar165._4_4_ = uVar1;
          auVar165._0_4_ = uVar1;
          auVar165._8_4_ = uVar1;
          auVar165._12_4_ = uVar1;
          auVar165._16_4_ = uVar1;
          auVar165._20_4_ = uVar1;
          auVar165._24_4_ = uVar1;
          auVar165._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar173._4_4_ = uVar1;
          auVar173._0_4_ = uVar1;
          auVar173._8_4_ = uVar1;
          auVar173._12_4_ = uVar1;
          auVar173._16_4_ = uVar1;
          auVar173._20_4_ = uVar1;
          auVar173._24_4_ = uVar1;
          auVar173._28_4_ = uVar1;
          uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar175._4_4_ = uVar2;
          auVar175._0_4_ = uVar2;
          auVar175._8_4_ = uVar2;
          auVar175._12_4_ = uVar2;
          auVar175._16_4_ = uVar2;
          auVar175._20_4_ = uVar2;
          auVar175._24_4_ = uVar2;
          auVar175._28_4_ = uVar2;
          fVar117 = (ray->super_RayK<1>).dir.field_0.m128[1];
          auVar72 = vsubps_avx(auVar131,auVar165);
          fVar122 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar73 = vsubps_avx(auVar138,auVar173);
          auVar74 = vsubps_avx(auVar141,auVar175);
          fVar134 = auVar74._0_4_;
          fVar14 = auVar74._4_4_;
          auVar84._4_4_ = fVar117 * fVar14;
          auVar84._0_4_ = fVar117 * fVar134;
          fVar24 = auVar74._8_4_;
          auVar84._8_4_ = fVar117 * fVar24;
          fVar34 = auVar74._12_4_;
          auVar84._12_4_ = fVar117 * fVar34;
          fVar44 = auVar74._16_4_;
          auVar84._16_4_ = fVar117 * fVar44;
          fVar54 = auVar74._20_4_;
          auVar84._20_4_ = fVar117 * fVar54;
          fVar64 = auVar74._24_4_;
          auVar84._24_4_ = fVar117 * fVar64;
          auVar84._28_4_ = uVar1;
          fVar121 = auVar73._0_4_;
          fVar15 = auVar73._4_4_;
          auVar85._4_4_ = fVar122 * fVar15;
          auVar85._0_4_ = fVar122 * fVar121;
          fVar25 = auVar73._8_4_;
          auVar85._8_4_ = fVar122 * fVar25;
          fVar35 = auVar73._12_4_;
          auVar85._12_4_ = fVar122 * fVar35;
          fVar45 = auVar73._16_4_;
          auVar85._16_4_ = fVar122 * fVar45;
          fVar55 = auVar73._20_4_;
          auVar85._20_4_ = fVar122 * fVar55;
          fVar65 = auVar73._24_4_;
          auVar85._24_4_ = fVar122 * fVar65;
          auVar85._28_4_ = uVar2;
          auVar73 = vsubps_avx(auVar85,auVar84);
          fVar123 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar6 = auVar72._0_4_;
          fVar16 = auVar72._4_4_;
          auVar86._4_4_ = fVar122 * fVar16;
          auVar86._0_4_ = fVar122 * fVar6;
          fVar26 = auVar72._8_4_;
          auVar86._8_4_ = fVar122 * fVar26;
          fVar36 = auVar72._12_4_;
          auVar86._12_4_ = fVar122 * fVar36;
          fVar46 = auVar72._16_4_;
          auVar86._16_4_ = fVar122 * fVar46;
          fVar56 = auVar72._20_4_;
          auVar86._20_4_ = fVar122 * fVar56;
          fVar66 = auVar72._24_4_;
          auVar86._24_4_ = fVar122 * fVar66;
          auVar86._28_4_ = local_2700._28_4_;
          auVar87._4_4_ = fVar123 * fVar14;
          auVar87._0_4_ = fVar123 * fVar134;
          auVar87._8_4_ = fVar123 * fVar24;
          auVar87._12_4_ = fVar123 * fVar34;
          auVar87._16_4_ = fVar123 * fVar44;
          auVar87._20_4_ = fVar123 * fVar54;
          auVar87._24_4_ = fVar123 * fVar64;
          auVar87._28_4_ = uVar77;
          auVar72 = vsubps_avx(auVar87,auVar86);
          auVar88._4_4_ = fVar123 * fVar15;
          auVar88._0_4_ = fVar123 * fVar121;
          auVar88._8_4_ = fVar123 * fVar25;
          auVar88._12_4_ = fVar123 * fVar35;
          auVar88._16_4_ = fVar123 * fVar45;
          auVar88._20_4_ = fVar123 * fVar55;
          auVar88._24_4_ = fVar123 * fVar65;
          auVar88._28_4_ = uVar77;
          auVar89._4_4_ = fVar117 * fVar16;
          auVar89._0_4_ = fVar117 * fVar6;
          auVar89._8_4_ = fVar117 * fVar26;
          auVar89._12_4_ = fVar117 * fVar36;
          auVar89._16_4_ = fVar117 * fVar46;
          auVar89._20_4_ = fVar117 * fVar56;
          auVar89._24_4_ = fVar117 * fVar66;
          auVar89._28_4_ = fVar80;
          auVar74 = vsubps_avx(auVar89,auVar88);
          fVar7 = local_2740._0_4_;
          fVar17 = local_2740._4_4_;
          fVar27 = local_2740._8_4_;
          fVar37 = local_2740._12_4_;
          fVar47 = local_2740._16_4_;
          fVar57 = local_2740._20_4_;
          fVar67 = local_2740._24_4_;
          fVar8 = auVar111._0_4_;
          fVar18 = auVar111._4_4_;
          fVar28 = auVar111._8_4_;
          fVar38 = auVar111._12_4_;
          fVar48 = auVar111._16_4_;
          fVar58 = auVar111._20_4_;
          fVar68 = auVar111._24_4_;
          fVar9 = local_2700._0_4_;
          fVar19 = local_2700._4_4_;
          fVar29 = local_2700._8_4_;
          fVar39 = local_2700._12_4_;
          fVar49 = local_2700._16_4_;
          fVar59 = local_2700._20_4_;
          fVar69 = local_2700._24_4_;
          auVar120._0_4_ = fVar123 * fVar9 + fVar117 * fVar8 + fVar122 * fVar7;
          auVar120._4_4_ = fVar123 * fVar19 + fVar117 * fVar18 + fVar122 * fVar17;
          auVar120._8_4_ = fVar123 * fVar29 + fVar117 * fVar28 + fVar122 * fVar27;
          auVar120._12_4_ = fVar123 * fVar39 + fVar117 * fVar38 + fVar122 * fVar37;
          auVar120._16_4_ = fVar123 * fVar49 + fVar117 * fVar48 + fVar122 * fVar47;
          auVar120._20_4_ = fVar123 * fVar59 + fVar117 * fVar58 + fVar122 * fVar57;
          auVar120._24_4_ = fVar123 * fVar69 + fVar117 * fVar68 + fVar122 * fVar67;
          auVar120._28_4_ = fVar122 + fVar122 + fVar80;
          auVar113._8_4_ = 0x80000000;
          auVar113._0_8_ = 0x8000000080000000;
          auVar113._12_4_ = 0x80000000;
          auVar113._16_4_ = 0x80000000;
          auVar113._20_4_ = 0x80000000;
          auVar113._24_4_ = 0x80000000;
          auVar113._28_4_ = 0x80000000;
          auVar111 = vandps_avx(auVar120,auVar113);
          uVar93 = auVar111._0_4_;
          auVar139._0_4_ =
               (float)(uVar93 ^ (uint)(fVar126 * auVar73._0_4_ +
                                      fVar125 * auVar72._0_4_ + fVar124 * auVar74._0_4_));
          uVar95 = auVar111._4_4_;
          auVar139._4_4_ =
               (float)(uVar95 ^ (uint)(fVar12 * auVar73._4_4_ +
                                      fVar11 * auVar72._4_4_ + fVar10 * auVar74._4_4_));
          uVar154 = auVar111._8_4_;
          auVar139._8_4_ =
               (float)(uVar154 ^
                      (uint)(fVar22 * auVar73._8_4_ +
                            fVar21 * auVar72._8_4_ + fVar20 * auVar74._8_4_));
          uVar155 = auVar111._12_4_;
          auVar139._12_4_ =
               (float)(uVar155 ^
                      (uint)(fVar32 * auVar73._12_4_ +
                            fVar31 * auVar72._12_4_ + fVar30 * auVar74._12_4_));
          uVar156 = auVar111._16_4_;
          auVar139._16_4_ =
               (float)(uVar156 ^
                      (uint)(fVar42 * auVar73._16_4_ +
                            fVar41 * auVar72._16_4_ + fVar40 * auVar74._16_4_));
          uVar157 = auVar111._20_4_;
          auVar139._20_4_ =
               (float)(uVar157 ^
                      (uint)(fVar52 * auVar73._20_4_ +
                            fVar51 * auVar72._20_4_ + fVar50 * auVar74._20_4_));
          uVar158 = auVar111._24_4_;
          auVar139._24_4_ =
               (float)(uVar158 ^
                      (uint)(fVar62 * auVar73._24_4_ +
                            fVar61 * auVar72._24_4_ + fVar60 * auVar74._24_4_));
          uVar159 = auVar111._28_4_;
          auVar139._28_4_ =
               (float)(uVar159 ^ (uint)(auVar130._28_4_ + auVar70._28_4_ + auVar71._28_4_));
          auVar144._0_4_ =
               (float)(uVar93 ^ (uint)(auVar73._0_4_ * fVar133 +
                                      auVar72._0_4_ * fVar164 + fVar143 * auVar74._0_4_));
          auVar144._4_4_ =
               (float)(uVar95 ^ (uint)(auVar73._4_4_ * fVar13 +
                                      auVar72._4_4_ * fVar167 + fVar146 * auVar74._4_4_));
          auVar144._8_4_ =
               (float)(uVar154 ^
                      (uint)(auVar73._8_4_ * fVar23 +
                            auVar72._8_4_ * fVar168 + fVar147 * auVar74._8_4_));
          auVar144._12_4_ =
               (float)(uVar155 ^
                      (uint)(auVar73._12_4_ * fVar33 +
                            auVar72._12_4_ * fVar169 + fVar148 * auVar74._12_4_));
          auVar144._16_4_ =
               (float)(uVar156 ^
                      (uint)(auVar73._16_4_ * fVar43 +
                            auVar72._16_4_ * fVar170 + fVar149 * auVar74._16_4_));
          auVar144._20_4_ =
               (float)(uVar157 ^
                      (uint)(auVar73._20_4_ * fVar53 +
                            auVar72._20_4_ * fVar171 + fVar150 * auVar74._20_4_));
          auVar144._24_4_ =
               (float)(uVar158 ^
                      (uint)(auVar73._24_4_ * fVar63 +
                            auVar72._24_4_ * fVar172 + fVar151 * auVar74._24_4_));
          auVar144._28_4_ = (float)(uVar159 ^ (uint)(auVar72._28_4_ + auVar74._28_4_ + -0.0));
          auVar130 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar111 = vcmpps_avx(auVar139,auVar130,5);
          auVar130 = vcmpps_avx(auVar144,auVar130,5);
          auVar111 = vandps_avx(auVar111,auVar130);
          auVar114._8_4_ = 0x7fffffff;
          auVar114._0_8_ = 0x7fffffff7fffffff;
          auVar114._12_4_ = 0x7fffffff;
          auVar114._16_4_ = 0x7fffffff;
          auVar114._20_4_ = 0x7fffffff;
          auVar114._24_4_ = 0x7fffffff;
          auVar114._28_4_ = 0x7fffffff;
          local_2600 = vandps_avx(auVar120,auVar114);
          auVar130 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar120,4);
          auVar111 = vandps_avx(auVar111,auVar130);
          auVar115._0_4_ = auVar144._0_4_ + auVar139._0_4_;
          auVar115._4_4_ = auVar144._4_4_ + auVar139._4_4_;
          auVar115._8_4_ = auVar144._8_4_ + auVar139._8_4_;
          auVar115._12_4_ = auVar144._12_4_ + auVar139._12_4_;
          auVar115._16_4_ = auVar144._16_4_ + auVar139._16_4_;
          auVar115._20_4_ = auVar144._20_4_ + auVar139._20_4_;
          auVar115._24_4_ = auVar144._24_4_ + auVar139._24_4_;
          auVar115._28_4_ = auVar144._28_4_ + auVar139._28_4_;
          auVar70 = vcmpps_avx(auVar115,local_2600,2);
          auVar130 = vandps_avx(auVar111,auVar70);
          auVar71 = local_26a0 & auVar130;
          if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar71 >> 0x7f,0) != '\0') ||
                (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar71 >> 0xbf,0) != '\0') ||
              (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar71[0x1f] < '\0') {
            auVar130 = vandps_avx(auVar130,local_26a0);
            local_2620._0_4_ =
                 (float)(uVar93 ^ (uint)(fVar9 * fVar6 + fVar8 * fVar121 + fVar134 * fVar7));
            local_2620._4_4_ =
                 (float)(uVar95 ^ (uint)(fVar19 * fVar16 + fVar18 * fVar15 + fVar14 * fVar17));
            local_2620._8_4_ =
                 (float)(uVar154 ^ (uint)(fVar29 * fVar26 + fVar28 * fVar25 + fVar24 * fVar27));
            local_2620._12_4_ =
                 (float)(uVar155 ^ (uint)(fVar39 * fVar36 + fVar38 * fVar35 + fVar34 * fVar37));
            local_2620._16_4_ =
                 (float)(uVar156 ^ (uint)(fVar49 * fVar46 + fVar48 * fVar45 + fVar44 * fVar47));
            local_2620._20_4_ =
                 (float)(uVar157 ^ (uint)(fVar59 * fVar56 + fVar58 * fVar55 + fVar54 * fVar57));
            local_2620._24_4_ =
                 (float)(uVar158 ^ (uint)(fVar69 * fVar66 + fVar68 * fVar65 + fVar64 * fVar67));
            local_2620._28_4_ = uVar159 ^ (uint)(auVar70._28_4_ + auVar70._28_4_ + auVar111._28_4_);
            fVar117 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar122 = local_2600._0_4_;
            fVar123 = local_2600._4_4_;
            auVar90._4_4_ = fVar123 * fVar117;
            auVar90._0_4_ = fVar122 * fVar117;
            fVar124 = local_2600._8_4_;
            auVar90._8_4_ = fVar124 * fVar117;
            fVar125 = local_2600._12_4_;
            auVar90._12_4_ = fVar125 * fVar117;
            fVar126 = local_2600._16_4_;
            auVar90._16_4_ = fVar126 * fVar117;
            fVar133 = local_2600._20_4_;
            auVar90._20_4_ = fVar133 * fVar117;
            fVar134 = local_2600._24_4_;
            auVar90._24_4_ = fVar134 * fVar117;
            auVar90._28_4_ = fVar117;
            auVar111 = vcmpps_avx(auVar90,local_2620,1);
            fVar117 = (ray->super_RayK<1>).tfar;
            auVar91._4_4_ = fVar123 * fVar117;
            auVar91._0_4_ = fVar122 * fVar117;
            auVar91._8_4_ = fVar124 * fVar117;
            auVar91._12_4_ = fVar125 * fVar117;
            auVar91._16_4_ = fVar126 * fVar117;
            auVar91._20_4_ = fVar133 * fVar117;
            auVar91._24_4_ = fVar134 * fVar117;
            auVar91._28_4_ = fVar117;
            auVar70 = vcmpps_avx(local_2620,auVar91,2);
            auVar111 = vandps_avx(auVar70,auVar111);
            auVar70 = auVar130 & auVar111;
            if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar70 >> 0x7f,0) != '\0') ||
                  (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar70 >> 0xbf,0) != '\0') ||
                (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar70[0x1f] < '\0') {
              auVar70 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar142 = ZEXT3264(auVar70);
              auVar111 = vandps_avx(auVar130,auVar111);
              local_25c0 = auVar111;
              auVar130 = vsubps_avx(local_2600,auVar144);
              local_2660 = vblendvps_avx(auVar139,auVar130,local_24c0);
              auVar130 = vsubps_avx(local_2600,auVar139);
              local_2640 = vblendvps_avx(auVar144,auVar130,local_24c0);
              uStack_2524 = local_24c0._28_4_;
              local_2540[0] = fVar9 * (float)local_24e0._0_4_;
              local_2540[1] = fVar19 * (float)local_24e0._4_4_;
              local_2540[2] = fVar29 * fStack_24d8;
              local_2540[3] = fVar39 * fStack_24d4;
              fStack_2530 = fVar49 * fStack_24d0;
              fStack_252c = fVar59 * fStack_24cc;
              fStack_2528 = fVar69 * fStack_24c8;
              local_2520[0] = fVar8 * (float)local_24e0._0_4_;
              local_2520[1] = fVar18 * (float)local_24e0._4_4_;
              local_2520[2] = fVar28 * fStack_24d8;
              local_2520[3] = fVar38 * fStack_24d4;
              fStack_2510 = fVar48 * fStack_24d0;
              fStack_250c = fVar58 * fStack_24cc;
              fStack_2508 = fVar68 * fStack_24c8;
              uStack_2504 = uStack_2524;
              local_2500[0] = (float)local_24e0._0_4_ * fVar7;
              local_2500[1] = (float)local_24e0._4_4_ * fVar17;
              local_2500[2] = fStack_24d8 * fVar27;
              local_2500[3] = fStack_24d4 * fVar37;
              fStack_24f0 = fStack_24d0 * fVar47;
              fStack_24ec = fStack_24cc * fVar57;
              fStack_24e8 = fStack_24c8 * fVar67;
              uStack_24e4 = uStack_2524;
              local_2720 = auVar111;
              auVar130 = vrcpps_avx(local_2600);
              fVar117 = auVar130._0_4_;
              fVar121 = auVar130._4_4_;
              auVar92._4_4_ = fVar123 * fVar121;
              auVar92._0_4_ = fVar122 * fVar117;
              fVar122 = auVar130._8_4_;
              auVar92._8_4_ = fVar124 * fVar122;
              fVar123 = auVar130._12_4_;
              auVar92._12_4_ = fVar125 * fVar123;
              fVar124 = auVar130._16_4_;
              auVar92._16_4_ = fVar126 * fVar124;
              fVar125 = auVar130._20_4_;
              auVar92._20_4_ = fVar133 * fVar125;
              fVar126 = auVar130._24_4_;
              auVar92._24_4_ = fVar134 * fVar126;
              auVar92._28_4_ = local_2600._28_4_;
              auVar140._8_4_ = 0x3f800000;
              auVar140._0_8_ = 0x3f8000003f800000;
              auVar140._12_4_ = 0x3f800000;
              auVar140._16_4_ = 0x3f800000;
              auVar140._20_4_ = 0x3f800000;
              auVar140._24_4_ = 0x3f800000;
              auVar140._28_4_ = 0x3f800000;
              auVar130 = vsubps_avx(auVar140,auVar92);
              fVar117 = fVar117 + fVar117 * auVar130._0_4_;
              fVar121 = fVar121 + fVar121 * auVar130._4_4_;
              fVar122 = fVar122 + fVar122 * auVar130._8_4_;
              fVar123 = fVar123 + fVar123 * auVar130._12_4_;
              fVar124 = fVar124 + fVar124 * auVar130._16_4_;
              fVar125 = fVar125 + fVar125 * auVar130._20_4_;
              fVar126 = fVar126 + fVar126 * auVar130._24_4_;
              local_2560._4_4_ = fVar121 * local_2620._4_4_;
              local_2560._0_4_ = fVar117 * local_2620._0_4_;
              local_2560._8_4_ = fVar122 * local_2620._8_4_;
              local_2560._12_4_ = fVar123 * local_2620._12_4_;
              local_2560._16_4_ = fVar124 * local_2620._16_4_;
              local_2560._20_4_ = fVar125 * local_2620._20_4_;
              local_2560._24_4_ = fVar126 * local_2620._24_4_;
              local_2560._28_4_ = auVar130._28_4_;
              auVar108 = ZEXT3264(local_2560);
              local_25a0[0] = local_2660._0_4_ * fVar117;
              local_25a0[1] = local_2660._4_4_ * fVar121;
              local_25a0[2] = local_2660._8_4_ * fVar122;
              local_25a0[3] = local_2660._12_4_ * fVar123;
              fStack_2590 = local_2660._16_4_ * fVar124;
              fStack_258c = local_2660._20_4_ * fVar125;
              fStack_2588 = local_2660._24_4_ * fVar126;
              uStack_2584 = local_2660._28_4_;
              local_2580[0] = local_2640._0_4_ * fVar117;
              local_2580[1] = local_2640._4_4_ * fVar121;
              local_2580[2] = local_2640._8_4_ * fVar122;
              local_2580[3] = local_2640._12_4_ * fVar123;
              fStack_2570 = local_2640._16_4_ * fVar124;
              fStack_256c = local_2640._20_4_ * fVar125;
              fStack_2568 = local_2640._24_4_ * fVar126;
              uStack_2564 = local_2660._28_4_;
              auVar106._8_4_ = 0x7f800000;
              auVar106._0_8_ = 0x7f8000007f800000;
              auVar106._12_4_ = 0x7f800000;
              auVar106._16_4_ = 0x7f800000;
              auVar106._20_4_ = 0x7f800000;
              auVar106._24_4_ = 0x7f800000;
              auVar106._28_4_ = 0x7f800000;
              auVar130 = vblendvps_avx(auVar106,local_2560,auVar111);
              auVar71 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar71 = vminps_avx(auVar130,auVar71);
              auVar72 = vshufpd_avx(auVar71,auVar71,5);
              auVar71 = vminps_avx(auVar71,auVar72);
              auVar72 = vperm2f128_avx(auVar71,auVar71,1);
              auVar71 = vminps_avx(auVar71,auVar72);
              auVar130 = vcmpps_avx(auVar130,auVar71,0);
              auVar71 = auVar111 & auVar130;
              if ((((((((auVar71 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar71 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar71 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar71 >> 0x7f,0) != '\0') ||
                    (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar71 >> 0xbf,0) != '\0') ||
                  (auVar71 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar71[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar130,auVar111);
              }
              uVar1 = vextractps_avx(auVar70._0_16_,1);
              local_27e0._0_4_ = uVar1;
              uVar95 = vmovmskps_avx(auVar111);
              uVar93 = 0;
              if (uVar95 != 0) {
                for (; (uVar95 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
                }
              }
              local_2700._0_8_ = local_27f0->scene;
              pSVar99 = local_27f0->scene;
LAB_00e64fc5:
              uVar104 = CONCAT44(0,uVar93);
              local_2758 = *(uint *)((long)&local_23c0 + uVar104 * 4);
              local_27c0._0_8_ = CONCAT44(0,local_2758);
              pGVar5 = (pSVar99->geometries).items[CONCAT44(0,local_2758)].ptr;
              if ((pGVar5->mask & local_27e0._0_4_) == 0) {
                *(undefined4 *)(local_2720 + uVar104 * 4) = 0;
                uVar93 = local_27e0._0_4_;
              }
              else {
                local_27e0._0_8_ = uVar104;
                local_2740._0_8_ = local_27f0->args;
                local_26e0 = auVar142._0_32_;
                local_26c0 = auVar108._0_32_;
                if (local_27f0->args->filter == (RTCFilterFunctionN)0x0) {
                  local_27a0.context = local_27f0->user;
                  if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar117 = local_25a0[uVar104];
                    fVar122 = local_2580[uVar104];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar104 * 4);
                    (ray->Ng).field_0.field_0.x = local_2540[uVar104];
                    (ray->Ng).field_0.field_0.y = local_2520[uVar104];
                    (ray->Ng).field_0.field_0.z = local_2500[uVar104];
                    ray->u = fVar117;
                    ray->v = fVar122;
                    ray->primID = *(uint *)((long)&local_2680 + uVar104 * 4);
                    ray->geomID = local_2758;
                    ray->instID[0] = (local_27a0.context)->instID[0];
                    ray->instPrimID[0] = (local_27a0.context)->instPrimID[0];
                    goto LAB_00e64dfb;
                  }
                }
                else {
                  local_27a0.context = local_27f0->user;
                }
                local_2770 = local_2540[uVar104];
                local_276c = local_2520[uVar104];
                local_2768 = local_2500[uVar104];
                local_2764 = local_25a0[uVar104];
                local_2760 = local_2580[uVar104];
                local_275c = *(undefined4 *)((long)&local_2680 + uVar104 * 4);
                local_2754 = (local_27a0.context)->instID[0];
                local_2750 = (local_27a0.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar104 * 4);
                local_2804 = -1;
                local_27a0.valid = &local_2804;
                local_27a0.geometryUserPtr = pGVar5->userPtr;
                local_27c0._0_8_ = ray;
                local_27a0.ray = (RTCRayN *)ray;
                local_27a0.hit = (RTCHitN *)&local_2770;
                local_27a0.N = 1;
                if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar5->intersectionFilterN)(&local_27a0), *local_27a0.valid != 0)) {
                  if ((*(code **)(local_2740._0_8_ + 0x10) != (code *)0x0) &&
                     ((((*(byte *)local_2740._0_8_ & 2) != 0 ||
                       (((pGVar5->field_8).field_0x2 & 0x40) != 0)) &&
                      ((**(code **)(local_2740._0_8_ + 0x10))(&local_27a0), *local_27a0.valid == 0))
                     )) goto LAB_00e65295;
                  (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_27a0.hit;
                  (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_27a0.hit + 4);
                  (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_27a0.hit + 8);
                  *(float *)((long)local_27a0.ray + 0x3c) = *(float *)(local_27a0.hit + 0xc);
                  *(float *)((long)local_27a0.ray + 0x40) = *(float *)(local_27a0.hit + 0x10);
                  *(float *)((long)local_27a0.ray + 0x44) = *(float *)(local_27a0.hit + 0x14);
                  *(float *)((long)local_27a0.ray + 0x48) = *(float *)(local_27a0.hit + 0x18);
                  *(float *)((long)local_27a0.ray + 0x4c) = *(float *)(local_27a0.hit + 0x1c);
                  *(float *)((long)local_27a0.ray + 0x50) = *(float *)(local_27a0.hit + 0x20);
                }
                else {
LAB_00e65295:
                  *(undefined4 *)(local_27c0._0_8_ + 0x20) = local_26e0._0_4_;
                }
                *(undefined4 *)(local_2720 + local_27e0._0_8_ * 4) = 0;
                fVar117 = ((RayK<1> *)local_27c0._0_8_)->tfar;
                auVar107._4_4_ = fVar117;
                auVar107._0_4_ = fVar117;
                auVar107._8_4_ = fVar117;
                auVar107._12_4_ = fVar117;
                auVar107._16_4_ = fVar117;
                auVar107._20_4_ = fVar117;
                auVar107._24_4_ = fVar117;
                auVar107._28_4_ = fVar117;
                auVar108 = ZEXT3264(local_26c0);
                auVar111 = vcmpps_avx(local_26c0,auVar107,2);
                local_2720 = vandps_avx(auVar111,local_2720);
                auVar142 = ZEXT464((uint)((RayK<1> *)local_27c0._0_8_)->tfar);
                ray = (RayHit *)local_27c0._0_8_;
                uVar93 = ((RayK<1> *)local_27c0._0_8_)->mask;
              }
              if ((((((((local_2720 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2720 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2720 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2720 >> 0x7f,0) == '\0') &&
                    (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2720 >> 0xbf,0) == '\0') &&
                  (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2720[0x1f]) goto LAB_00e64dfb;
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar111 = vblendvps_avx(auVar116,auVar108._0_32_,local_2720);
              auVar130 = vshufps_avx(auVar111,auVar111,0xb1);
              auVar130 = vminps_avx(auVar111,auVar130);
              auVar70 = vshufpd_avx(auVar130,auVar130,5);
              auVar130 = vminps_avx(auVar130,auVar70);
              auVar70 = vperm2f128_avx(auVar130,auVar130,1);
              auVar130 = vminps_avx(auVar130,auVar70);
              auVar130 = vcmpps_avx(auVar111,auVar130,0);
              auVar70 = local_2720 & auVar130;
              auVar111 = local_2720;
              if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0x7f,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar70 >> 0xbf,0) != '\0') ||
                  (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar70[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar130,local_2720);
              }
              local_27e0._0_4_ = uVar93;
              uVar95 = vmovmskps_avx(auVar111);
              uVar93 = 0;
              pSVar99 = (Scene *)local_2700._0_8_;
              if (uVar95 != 0) {
                for (; (uVar95 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
                }
              }
              goto LAB_00e64fc5;
            }
          }
LAB_00e64dfb:
          auVar142 = ZEXT3264(local_23e0);
          auVar145 = ZEXT3264(local_2400);
          auVar153 = ZEXT3264(local_2420);
          auVar161 = ZEXT3264(local_2440);
          auVar163 = ZEXT3264(local_2460);
          auVar166 = ZEXT3264(local_2480);
          auVar174 = ZEXT3264(local_24a0);
        }
        fVar117 = (ray->super_RayK<1>).tfar;
        auVar108 = ZEXT3264(CONCAT428(fVar117,CONCAT424(fVar117,CONCAT420(fVar117,CONCAT416(fVar117,
                                                  CONCAT412(fVar117,CONCAT48(fVar117,CONCAT44(
                                                  fVar117,fVar117))))))));
      }
      goto LAB_00e6485e;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }